

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

void __thiscall QListWidgetItem::setData(QListWidgetItem *this,int role,QVariant *value)

{
  long lVar1;
  initializer_list<int> args;
  initializer_list<int> args_00;
  bool bVar2;
  qsizetype qVar3;
  const_reference pQVar4;
  reference pQVar5;
  QListModel *pQVar6;
  QList<int> *this_00;
  QListWidgetItem *in_RDX;
  int in_ESI;
  QListModel *in_RDI;
  long in_FS_OFFSET;
  QListModel *model;
  int i;
  bool found;
  QList<int> roles;
  QVariant *in_stack_ffffffffffffff38;
  rvalue_ref t;
  QListWidgetItem *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff50;
  int iVar7;
  int local_78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  if (in_ESI == 2) {
    in_ESI = 0;
  }
  local_78 = 0;
  iVar7 = in_ESI;
  do {
    this_00 = (QList<int> *)(long)local_78;
    qVar3 = QList<QWidgetItemData>::size((QList<QWidgetItemData> *)((in_RDI->items).d.ptr + 1));
    if (qVar3 <= (long)this_00) {
LAB_0089c1aa:
      if (!bVar2) {
        t = (rvalue_ref)((in_RDI->items).d.ptr + 1);
        QWidgetItemData::QWidgetItemData
                  ((QWidgetItemData *)in_stack_ffffffffffffff40,(int)((ulong)t >> 0x20),
                   (QVariant *)0x89c1d8);
        QList<QWidgetItemData>::append((QList<QWidgetItemData> *)in_stack_ffffffffffffff40,t);
        QWidgetItemData::~QWidgetItemData((QWidgetItemData *)0x89c1f6);
      }
      pQVar6 = listModel(in_stack_ffffffffffffff40);
      if (pQVar6 != (QListModel *)0x0) {
        if (in_ESI == 0) {
          args._M_array._4_4_ = iVar7;
          args._M_array._0_4_ = in_stack_ffffffffffffff50;
          args._M_len = (size_type)in_RDI;
          QList<int>::QList(this_00,args);
        }
        else {
          args_00._M_array._4_4_ = iVar7;
          args_00._M_array._0_4_ = in_stack_ffffffffffffff50;
          args_00._M_len = (size_type)in_RDI;
          QList<int>::QList(this_00,args_00);
        }
        QListModel::itemChanged
                  (in_RDI,(QListWidgetItem *)CONCAT44(iVar7,in_stack_ffffffffffffff50),this_00);
        QList<int>::~QList((QList<int> *)0x89c2d4);
      }
LAB_0089c2d4:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return;
    }
    pQVar4 = QList<QWidgetItemData>::at
                       ((QList<QWidgetItemData> *)in_stack_ffffffffffffff40,
                        (qsizetype)in_stack_ffffffffffffff38);
    if (pQVar4->role == in_ESI) {
      QList<QWidgetItemData>::at
                ((QList<QWidgetItemData> *)in_stack_ffffffffffffff40,
                 (qsizetype)in_stack_ffffffffffffff38);
      bVar2 = ::operator==((QVariant *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      if (bVar2) goto LAB_0089c2d4;
      pQVar5 = QList<QWidgetItemData>::operator[]
                         ((QList<QWidgetItemData> *)in_RDX,(qsizetype)in_stack_ffffffffffffff38);
      ::QVariant::operator=(&pQVar5->value,(QVariant *)in_RDX);
      bVar2 = true;
      in_stack_ffffffffffffff40 = in_RDX;
      goto LAB_0089c1aa;
    }
    local_78 = local_78 + 1;
  } while( true );
}

Assistant:

void QListWidgetItem::setData(int role, const QVariant &value)
{
    bool found = false;
    role = (role == Qt::EditRole ? Qt::DisplayRole : role);
    for (int i = 0; i < d->values.size(); ++i) {
        if (d->values.at(i).role == role) {
            if (d->values.at(i).value == value)
                return;
            d->values[i].value = value;
            found = true;
            break;
        }
    }
    if (!found)
        d->values.append(QWidgetItemData(role, value));
    if (QListModel *model = listModel()) {
        const QList<int> roles((role == Qt::DisplayRole)
                                       ? QList<int>({ Qt::DisplayRole, Qt::EditRole })
                                       : QList<int>({ role }));
        model->itemChanged(this, roles);
    }
}